

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Subst_Forward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long col;
  long lVar9;
  long row;
  double dVar10;
  int extraout_var_00;
  
  lVar8 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((lVar8 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  col = 0;
  lVar8 = 0;
  if (lVar5 != 0 && -1 < extraout_var_00) {
    lVar8 = lVar5;
  }
  do {
    if ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= col) {
      return 1;
    }
    for (lVar9 = 0; row = lVar8, lVar8 != lVar9; lVar9 = lVar9 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()(B,lVar9,col);
      row = lVar9;
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) break;
    }
    lVar9 = row;
    if (row < lVar5) {
      lVar9 = lVar5;
    }
    while (row != lVar9) {
      ppdVar2 = (this->fElem).fStore;
      pdVar6 = ppdVar2[row];
      pdVar3 = ppdVar2[row + 1];
      pdVar7 = TPZFMatrix<double>::operator()(B,row,col);
      dVar10 = 0.0;
      while( true ) {
        pdVar6 = pdVar6 + 1;
        pdVar7 = pdVar7 + -1;
        if (pdVar3 <= pdVar6) break;
        dVar10 = dVar10 + *pdVar6 * *pdVar7;
      }
      pdVar6 = TPZFMatrix<double>::operator()(B,row,col);
      dVar1 = *pdVar6;
      *pdVar6 = dVar1 - dVar10;
      *pdVar6 = (dVar1 - dVar10) / *(this->fElem).fStore[row];
      row = row + 1;
    }
    col = col + 1;
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}